

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

bool dxil_spv::emit_saturate_instruction(Impl *impl,CallInst *instruction)

{
  Operation *this;
  CallInst *pCVar1;
  bool bVar2;
  Id IVar3;
  TypeID TVar4;
  Type *pTVar5;
  Value *value;
  Id local_54;
  Id local_50;
  Id local_4c;
  initializer_list<unsigned_int> local_48;
  Operation *local_38;
  Operation *op;
  Id constant_1;
  Id constant_0;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  _constant_1 = Converter::Impl::builder(impl);
  if ((int)instruction_local[0x16].super_Instruction.attachments._M_h._M_element_count == 0) {
    IVar3 = spv::Builder::import(_constant_1,"GLSL.std.450");
    *(Id *)&instruction_local[0x16].super_Instruction.attachments._M_h._M_element_count = IVar3;
  }
  pTVar5 = LLVMBC::Value::getType((Value *)builder);
  TVar4 = LLVMBC::Type::getTypeID(pTVar5);
  if (TVar4 == HalfTyID) {
    bVar2 = Converter::Impl::support_native_fp16_operations((Impl *)instruction_local);
    if (bVar2) {
      op._4_4_ = spv::Builder::makeFloat16Constant(_constant_1,0,false);
      op._0_4_ = spv::Builder::makeFloat16Constant(_constant_1,0x3c00,false);
    }
    else {
      op._4_4_ = spv::Builder::makeFloatConstant(_constant_1,0.0,false);
      op._0_4_ = spv::Builder::makeFloatConstant(_constant_1,1.0,false);
    }
  }
  else if (TVar4 == FloatTyID) {
    op._4_4_ = spv::Builder::makeFloatConstant(_constant_1,0.0,false);
    op._0_4_ = spv::Builder::makeFloatConstant(_constant_1,1.0,false);
  }
  else {
    if (TVar4 != DoubleTyID) {
      return false;
    }
    op._4_4_ = spv::Builder::makeDoubleConstant(_constant_1,0.0,false);
    op._0_4_ = spv::Builder::makeDoubleConstant(_constant_1,1.0,false);
  }
  local_38 = Converter::Impl::allocate((Impl *)instruction_local,OpExtInst,(Value *)builder);
  Operation::add_id(local_38,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                                 _M_element_count);
  Operation::add_literal(local_38,0x51);
  pCVar1 = instruction_local;
  this = local_38;
  value = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
  local_54 = Converter::Impl::get_id_for_value((Impl *)pCVar1,value,0);
  local_50 = op._4_4_;
  local_4c = (Id)op;
  local_48._M_array = &local_54;
  local_48._M_len = 3;
  Operation::add_ids(this,&local_48);
  Converter::Impl::add((Impl *)instruction_local,local_38,false);
  pCVar1 = instruction_local;
  pTVar5 = LLVMBC::Value::getType((Value *)builder);
  Converter::Impl::decorate_relaxed_precision((Impl *)pCVar1,pTVar5,local_38->id,false);
  return true;
}

Assistant:

bool emit_saturate_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	spv::Id constant_0, constant_1;

	switch (instruction->getType()->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
		if (impl.support_native_fp16_operations())
		{
			constant_0 = builder.makeFloat16Constant(0);
			constant_1 = builder.makeFloat16Constant(0x3c00);
		}
		else
		{
			constant_0 = builder.makeFloatConstant(0.0f);
			constant_1 = builder.makeFloatConstant(1.0f);
		}
		break;

	case llvm::Type::TypeID::FloatTyID:
		constant_0 = builder.makeFloatConstant(0.0f);
		constant_1 = builder.makeFloatConstant(1.0f);
		break;

	case llvm::Type::TypeID::DoubleTyID:
		constant_0 = builder.makeDoubleConstant(0.0);
		constant_1 = builder.makeDoubleConstant(1.0);
		break;

	default:
		return false;
	}

	Operation *op = impl.allocate(spv::OpExtInst, instruction);
	op->add_id(impl.glsl_std450_ext);
	op->add_literal(GLSLstd450NClamp);
	op->add_ids({ impl.get_id_for_value(instruction->getOperand(1)),
	              constant_0, constant_1 });

	impl.add(op);
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);
	return true;
}